

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaReadVer.c
# Opt level: O1

int Prs_ManReadInstance(Prs_Man_t *p,int Func)

{
  byte bVar1;
  char cVar2;
  uint uVar3;
  int InstName;
  int iVar4;
  int Entry;
  char *pStr;
  byte *pbVar5;
  int Value;
  uint extraout_EDX;
  uint extraout_EDX_00;
  uint uVar6;
  ulong uVar7;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  byte *pbVar8;
  char *pcVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  
  pbVar8 = (byte *)p->pLimit;
  pbVar5 = (byte *)p->pCur;
  if (pbVar5 < pbVar8) {
LAB_003eab25:
    uVar7 = (ulong)*pbVar5;
    if (uVar7 < 0x30) {
      if ((0x100002600U >> (uVar7 & 0x3f) & 1) != 0) {
        pbVar5 = pbVar5 + 1;
        p->pCur = (char *)pbVar5;
        goto LAB_003eab25;
      }
      if (uVar7 != 0x2f) {
        if (uVar7 != 0) goto LAB_003eac29;
        goto LAB_003eabc7;
      }
      if (pbVar5[1] != 0x2a) {
        if (pbVar5[1] == 0x2f) {
          pbVar5 = pbVar5 + 2;
          p->pCur = (char *)pbVar5;
          if (pbVar5 < pbVar8) {
            while (*pbVar5 != 10) {
              pbVar5 = pbVar5 + 1;
              p->pCur = (char *)pbVar5;
              if (pbVar5 == pbVar8) goto LAB_003eac29;
            }
            pbVar5 = pbVar5 + 1;
            goto LAB_003eabb3;
          }
        }
        goto LAB_003eac29;
      }
      pbVar5 = pbVar5 + 2;
      p->pCur = (char *)pbVar5;
      if (pbVar8 <= pbVar5) goto LAB_003eac29;
      while ((*pbVar5 != 0x2a || (pbVar5[1] != 0x2f))) {
        pbVar5 = pbVar5 + 1;
        p->pCur = (char *)pbVar5;
        if (pbVar5 == pbVar8) goto LAB_003eac29;
      }
      pbVar5 = pbVar5 + 2;
LAB_003eabb3:
      p->pCur = (char *)pbVar5;
      if (pbVar8 <= pbVar5) goto LAB_003eabc7;
      goto LAB_003eab25;
    }
LAB_003eac29:
    if (*p->pCur != '#') goto LAB_003eaceb;
    pbVar5 = (byte *)p->pCur;
    do {
      pbVar5 = pbVar5 + 1;
      p->pCur = (char *)pbVar5;
    } while (0xf5 < (byte)(*pbVar5 - 0x3a));
    while( true ) {
      if (pbVar8 <= pbVar5) goto LAB_003eabc7;
      while( true ) {
        uVar7 = (ulong)*pbVar5;
        if (0x2f < uVar7) goto LAB_003eaceb;
        if ((0x100002600U >> (uVar7 & 0x3f) & 1) == 0) break;
        pbVar5 = pbVar5 + 1;
        p->pCur = (char *)pbVar5;
      }
      if (uVar7 != 0x2f) break;
      if (pbVar5[1] != 0x2a) {
        if (pbVar5[1] == 0x2f) {
          pbVar5 = pbVar5 + 2;
          p->pCur = (char *)pbVar5;
          if (pbVar5 < pbVar8) {
            while (*pbVar5 != 10) {
              pbVar5 = pbVar5 + 1;
              p->pCur = (char *)pbVar5;
              if (pbVar5 == pbVar8) goto LAB_003eaceb;
            }
            pbVar5 = pbVar5 + 1;
            goto LAB_003eacd9;
          }
        }
        goto LAB_003eaceb;
      }
      pbVar5 = pbVar5 + 2;
      p->pCur = (char *)pbVar5;
      if (pbVar8 <= pbVar5) goto LAB_003eaceb;
      while ((*pbVar5 != 0x2a || (pbVar5[1] != 0x2f))) {
        pbVar5 = pbVar5 + 1;
        p->pCur = (char *)pbVar5;
        if (pbVar5 == pbVar8) goto LAB_003eaceb;
      }
      pbVar5 = pbVar5 + 2;
LAB_003eacd9:
      p->pCur = (char *)pbVar5;
    }
    if (uVar7 == 0) goto LAB_003eabc7;
LAB_003eaceb:
    pbVar8 = (byte *)p->pCur;
    bVar1 = *pbVar8;
    if (bVar1 == 0x5c) {
      pbVar8 = pbVar8 + 1;
      pbVar5 = pbVar8;
      do {
        p->pCur = (char *)pbVar5;
        bVar1 = *pbVar5;
        pbVar5 = pbVar5 + 1;
      } while (bVar1 != 0x20);
LAB_003ead43:
      InstName = Abc_NamStrFindOrAddLim(p->pStrs,(char *)pbVar8,p->pCur,(int *)0x0);
    }
    else if ((bVar1 == 0x5f) || (InstName = 0, 0xe5 < (byte)((bVar1 & 0xdf) + 0xa5))) {
      pbVar5 = pbVar8 + 1;
      do {
        do {
          p->pCur = (char *)pbVar5;
          bVar1 = *pbVar5;
          pbVar5 = pbVar5 + 1;
        } while (0xf5 < (byte)(bVar1 - 0x3a));
      } while (((bVar1 == 0x24) || (bVar1 == 0x5f)) || (0xe5 < (byte)((bVar1 & 0xdf) + 0xa5)));
      goto LAB_003ead43;
    }
    if (InstName != 0) {
      pbVar8 = (byte *)p->pLimit;
      pbVar5 = (byte *)p->pCur;
      do {
        if (pbVar8 <= pbVar5) {
LAB_003eae07:
          if (p->ErrorStr[0] == '\0') {
            builtin_strncpy(p->ErrorStr,"Unexpectedly reached end-of-file.",0x22);
            if (p->ErrorStr[0] != '\0') goto LAB_003eb60d;
            uVar13._0_1_ = ' ';
            uVar13._1_1_ = '2';
            uVar13._2_1_ = '6';
            uVar13._3_1_ = '.';
            goto LAB_003eac11;
          }
          goto LAB_003eb60d;
        }
        while( true ) {
          uVar7 = (ulong)*pbVar5;
          if (0x2f < uVar7) goto LAB_003eae56;
          if ((0x100002600U >> (uVar7 & 0x3f) & 1) == 0) break;
          pbVar5 = pbVar5 + 1;
          p->pCur = (char *)pbVar5;
        }
        if (uVar7 != 0x2f) {
          if (uVar7 == 0) goto LAB_003eae07;
          break;
        }
        if (pbVar5[1] != 0x2a) {
          if (pbVar5[1] == 0x2f) {
            pbVar5 = pbVar5 + 2;
            p->pCur = (char *)pbVar5;
            if (pbVar5 < pbVar8) {
              while (*pbVar5 != 10) {
                pbVar5 = pbVar5 + 1;
                p->pCur = (char *)pbVar5;
                if (pbVar5 == pbVar8) goto LAB_003eae56;
              }
              pbVar5 = pbVar5 + 1;
              goto LAB_003eadf9;
            }
          }
          break;
        }
        pbVar5 = pbVar5 + 2;
        p->pCur = (char *)pbVar5;
        if (pbVar8 <= pbVar5) break;
        while ((*pbVar5 != 0x2a || (pbVar5[1] != 0x2f))) {
          pbVar5 = pbVar5 + 1;
          p->pCur = (char *)pbVar5;
          if (pbVar5 == pbVar8) goto LAB_003eae56;
        }
        pbVar5 = pbVar5 + 2;
LAB_003eadf9:
        p->pCur = (char *)pbVar5;
      } while( true );
    }
LAB_003eae56:
    if (*p->pCur != '(') {
      if (p->ErrorStr[0] == '\0') {
        builtin_strncpy(p->ErrorStr,"Expecting \"(\" in module instantiation.",0x27);
        return 0;
      }
      goto LAB_003eb60d;
    }
    pbVar5 = (byte *)(p->pCur + 1);
    p->pCur = (char *)pbVar5;
    pbVar8 = (byte *)p->pLimit;
    do {
      if (pbVar8 <= pbVar5) {
LAB_003eaf56:
        if (p->ErrorStr[0] == '\0') {
          builtin_strncpy(p->ErrorStr,"Unexpectedly reached end-of-file.",0x22);
          if (p->ErrorStr[0] != '\0') goto LAB_003eb60d;
          uVar13._0_1_ = ' ';
          uVar13._1_1_ = '2';
          uVar13._2_1_ = '7';
          uVar13._3_1_ = '.';
          goto LAB_003eac11;
        }
        goto LAB_003eb60d;
      }
      while( true ) {
        uVar7 = (ulong)*pbVar5;
        if (0x2f < uVar7) goto LAB_003eafa5;
        if ((0x100002600U >> (uVar7 & 0x3f) & 1) == 0) break;
        pbVar5 = pbVar5 + 1;
        p->pCur = (char *)pbVar5;
      }
      if (uVar7 != 0x2f) {
        if (uVar7 == 0) goto LAB_003eaf56;
LAB_003eafa5:
        pcVar9 = p->pCur;
        if (*pcVar9 != '.') {
          pcVar9 = Abc_NamStr(p->pStrs,Func);
          Func = Prs_ManIsVerilogPrim(pcVar9);
          if (Func == 0) {
            Prs_ManErrorSet(p,"Cannot find elementary gate.",Value);
            return 0;
          }
          iVar4 = Prs_ManReadSignalList(p,&p->vTemp,')',1);
          uVar6 = extraout_EDX;
          goto LAB_003eb468;
        }
        (p->vTemp).nSize = 0;
        if (*pcVar9 != '.') {
          __assert_fail("Prs_ManIsChar(p, \'.\')",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadVer.c"
                        ,0x284,"int Prs_ManReadSignalList2(Prs_Man_t *, Vec_Int_t *)");
        }
        goto LAB_003eafca;
      }
      bVar1 = pbVar5[1];
      uVar7 = (ulong)bVar1;
      if (bVar1 != 0x2a) {
        if (bVar1 == 0x2f) {
          pbVar5 = pbVar5 + 2;
          p->pCur = (char *)pbVar5;
          if (pbVar5 < pbVar8) {
            while (*pbVar5 != 10) {
              pbVar5 = pbVar5 + 1;
              p->pCur = (char *)pbVar5;
              if (pbVar5 == pbVar8) goto LAB_003eafa5;
            }
            pbVar5 = pbVar5 + 1;
            goto LAB_003eaf0c;
          }
        }
        goto LAB_003eafa5;
      }
      pbVar5 = pbVar5 + 2;
      p->pCur = (char *)pbVar5;
      if (pbVar8 <= pbVar5) goto LAB_003eafa5;
      while ((*pbVar5 != 0x2a || (pbVar5[1] != 0x2f))) {
        pbVar5 = pbVar5 + 1;
        p->pCur = (char *)pbVar5;
        if (pbVar5 == pbVar8) goto LAB_003eafa5;
      }
      pbVar5 = pbVar5 + 2;
LAB_003eaf0c:
      p->pCur = (char *)pbVar5;
    } while( true );
  }
LAB_003eabc7:
  if (p->ErrorStr[0] == '\0') {
    builtin_strncpy(p->ErrorStr,"Unexpectedly reached end-of-file.",0x22);
    if (p->ErrorStr[0] == '\0') {
      uVar13._0_1_ = ' ';
      uVar13._1_1_ = '2';
      uVar13._2_1_ = '5';
      uVar13._3_1_ = '.';
LAB_003eac11:
      p->ErrorStr[0] = 'E';
      p->ErrorStr[1] = 'r';
      p->ErrorStr[2] = 'r';
      p->ErrorStr[3] = 'o';
      p->ErrorStr[4] = 'r';
      p->ErrorStr[5] = ' ';
      p->ErrorStr[6] = 'n';
      p->ErrorStr[7] = 'u';
      p->ErrorStr[8] = 'm';
      p->ErrorStr[9] = 'b';
      p->ErrorStr[10] = 'e';
      p->ErrorStr[0xb] = 'r';
      *(undefined4 *)(p->ErrorStr + 0xc) = uVar13;
      p->ErrorStr[0x10] = '\0';
      return 0;
    }
  }
LAB_003eb60d:
  __assert_fail("!p->ErrorStr[0]",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaPrs.h"
                ,0xc0,"int Prs_ManErrorSet(Prs_Man_t *, char *, int)");
LAB_003eafca:
  pStr = pcVar9 + 1;
  p->pCur = pStr;
  bVar1 = pcVar9[1];
  if (bVar1 == 0x5c) {
    pStr = pcVar9 + 2;
    pcVar9 = pStr;
    do {
      p->pCur = pcVar9;
      cVar2 = *pcVar9;
      pcVar9 = pcVar9 + 1;
    } while (cVar2 != ' ');
LAB_003eb030:
    iVar4 = Abc_NamStrFindOrAddLim(p->pStrs,pStr,p->pCur,(int *)0x0);
    uVar7 = extraout_RDX;
  }
  else if ((bVar1 == 0x5f) || (iVar4 = 0, 0xe5 < (byte)((bVar1 & 0xdf) + 0xa5))) {
    pbVar8 = (byte *)(pcVar9 + 2);
    do {
      do {
        p->pCur = (char *)pbVar8;
        bVar1 = *pbVar8;
        pbVar8 = pbVar8 + 1;
      } while (0xf5 < (byte)(bVar1 - 0x3a));
    } while (((bVar1 == 0x24) || (bVar1 == 0x5f)) || (0xe5 < (byte)((bVar1 & 0xdf) + 0xa5)));
    goto LAB_003eb030;
  }
  uVar6 = (uint)uVar7;
  if (iVar4 == 0) {
    if (p->ErrorStr[0] != '\0') goto LAB_003eb60d;
    builtin_strncpy(p->ErrorStr,"Cannot read formal name of the instance.",0x29);
    goto LAB_003eb466;
  }
  pbVar8 = (byte *)p->pLimit;
  pbVar5 = (byte *)p->pCur;
  while( true ) {
    uVar6 = (uint)uVar7;
    if (pbVar8 <= pbVar5) goto LAB_003eb3c9;
    while( true ) {
      uVar7 = (ulong)*pbVar5;
      uVar6 = (uint)*pbVar5;
      if (0x2f < uVar7) goto LAB_003eb0ed;
      if ((0x100002600U >> (uVar7 & 0x3f) & 1) == 0) break;
      pbVar5 = pbVar5 + 1;
      p->pCur = (char *)pbVar5;
    }
    if (uVar7 != 0x2f) break;
    bVar1 = pbVar5[1];
    uVar7 = (ulong)bVar1;
    if (bVar1 == 0x2a) {
      pbVar5 = pbVar5 + 2;
      p->pCur = (char *)pbVar5;
      if (pbVar8 <= pbVar5) goto LAB_003eb0ed;
      while ((*pbVar5 != 0x2a || (pbVar5[1] != 0x2f))) {
        pbVar5 = pbVar5 + 1;
        p->pCur = (char *)pbVar5;
        if (pbVar5 == pbVar8) goto LAB_003eb0ed;
      }
      pbVar5 = pbVar5 + 2;
    }
    else {
      if (bVar1 != 0x2f) goto LAB_003eb0ed;
      pbVar5 = pbVar5 + 2;
      p->pCur = (char *)pbVar5;
      if (pbVar8 <= pbVar5) goto LAB_003eb0ed;
      while (*pbVar5 != 10) {
        pbVar5 = pbVar5 + 1;
        p->pCur = (char *)pbVar5;
        if (pbVar5 == pbVar8) goto LAB_003eb0ed;
      }
      pbVar5 = pbVar5 + 1;
    }
    p->pCur = (char *)pbVar5;
  }
  if (uVar7 == 0) goto LAB_003eb3c9;
LAB_003eb0ed:
  uVar6 = (uint)uVar7;
  pbVar5 = (byte *)p->pCur;
  if (*pbVar5 != 0x28) {
    if (p->ErrorStr[0] != '\0') goto LAB_003eb60d;
    builtin_strncpy(p->ErrorStr + 0x10,"in the instance.",0x10);
    uVar10._0_1_ = 'C';
    uVar10._1_1_ = 'a';
    uVar10._2_1_ = 'n';
    uVar10._3_1_ = 'n';
    uVar11._0_1_ = 'o';
    uVar11._1_1_ = 't';
    uVar11._2_1_ = ' ';
    uVar11._3_1_ = 'r';
    uVar12._0_1_ = 'e';
    uVar12._1_1_ = 'a';
    uVar12._2_1_ = 'd';
    uVar12._3_1_ = ' ';
    uVar15._0_1_ = '\"';
    uVar15._1_1_ = '(';
    uVar15._2_1_ = '\"';
    uVar15._3_1_ = ' ';
    goto LAB_003eb601;
  }
  while( true ) {
    pbVar5 = pbVar5 + 1;
    while( true ) {
      uVar6 = (uint)uVar7;
      p->pCur = (char *)pbVar5;
      if (pbVar8 <= pbVar5) goto LAB_003eb3c9;
      while( true ) {
        uVar7 = (ulong)*pbVar5;
        uVar6 = (uint)*pbVar5;
        if (0x2f < uVar7) goto LAB_003eb184;
        if ((0x100002600U >> (uVar7 & 0x3f) & 1) == 0) break;
        pbVar5 = pbVar5 + 1;
        p->pCur = (char *)pbVar5;
      }
      if (uVar7 != 0x2f) {
        if (uVar7 != 0) goto LAB_003eb184;
        goto LAB_003eb3c9;
      }
      bVar1 = pbVar5[1];
      uVar7 = (ulong)bVar1;
      if (bVar1 != 0x2a) break;
      pbVar5 = pbVar5 + 2;
      p->pCur = (char *)pbVar5;
      if (pbVar8 <= pbVar5) goto LAB_003eb184;
      while ((*pbVar5 != 0x2a || (pbVar5[1] != 0x2f))) {
        pbVar5 = pbVar5 + 1;
        p->pCur = (char *)pbVar5;
        if (pbVar5 == pbVar8) goto LAB_003eb184;
      }
      pbVar5 = pbVar5 + 2;
    }
    if (bVar1 != 0x2f) break;
    pbVar5 = pbVar5 + 2;
    p->pCur = (char *)pbVar5;
    if (pbVar8 <= pbVar5) break;
    while (*pbVar5 != 10) {
      pbVar5 = pbVar5 + 1;
      p->pCur = (char *)pbVar5;
      if (pbVar5 == pbVar8) goto LAB_003eb184;
    }
  }
LAB_003eb184:
  Entry = Prs_ManReadSignal(p);
  uVar6 = (uint)extraout_RDX_00;
  if (Entry == 0) {
    if (p->ErrorStr[0] != '\0') goto LAB_003eb60d;
    builtin_strncpy(p->ErrorStr,"Cannot read actual name of an instance.",0x28);
    goto LAB_003eb466;
  }
  if (*p->pCur != ')') {
    if (p->ErrorStr[0] != '\0') goto LAB_003eb60d;
    builtin_strncpy(p->ErrorStr + 0x10,"in the instance.",0x10);
    uVar10._0_1_ = 'C';
    uVar10._1_1_ = 'a';
    uVar10._2_1_ = 'n';
    uVar10._3_1_ = 'n';
    uVar11._0_1_ = 'o';
    uVar11._1_1_ = 't';
    uVar11._2_1_ = ' ';
    uVar11._3_1_ = 'r';
    uVar12._0_1_ = 'e';
    uVar12._1_1_ = 'a';
    uVar12._2_1_ = 'd';
    uVar12._3_1_ = ' ';
    uVar15._0_1_ = '\"';
    uVar15._1_1_ = ')';
    uVar15._2_1_ = '\"';
    uVar15._3_1_ = ' ';
LAB_003eb601:
    *(undefined4 *)p->ErrorStr = uVar10;
    *(undefined4 *)(p->ErrorStr + 4) = uVar11;
    *(undefined4 *)(p->ErrorStr + 8) = uVar12;
    *(undefined4 *)(p->ErrorStr + 0xc) = uVar15;
    p->ErrorStr[0x20] = '\0';
    goto LAB_003eb466;
  }
  p->pCur = p->pCur + 1;
  uVar7 = extraout_RDX_00;
  if (Entry != 1) {
    Vec_IntPush(&p->vTemp,iVar4);
    Vec_IntPush(&p->vTemp,Entry);
    uVar7 = extraout_RDX_01;
  }
  pbVar8 = (byte *)p->pLimit;
  pbVar5 = (byte *)p->pCur;
LAB_003eb1d3:
  uVar6 = (uint)uVar7;
  if (pbVar8 <= pbVar5) {
LAB_003eb415:
    if (p->ErrorStr[0] != '\0') goto LAB_003eb60d;
    builtin_strncpy(p->ErrorStr,"Unexpectedly reached end-of-file.",0x22);
    if (p->ErrorStr[0] != '\0') goto LAB_003eb60d;
    uVar14._0_1_ = ' ';
    uVar14._1_1_ = '1';
    uVar14._2_1_ = '8';
    uVar14._3_1_ = '.';
    goto LAB_003eb45f;
  }
  while( true ) {
    uVar7 = (ulong)*pbVar5;
    uVar6 = (uint)*pbVar5;
    if (0x2f < uVar7) goto LAB_003eb27b;
    if ((0x100002600U >> (uVar7 & 0x3f) & 1) == 0) break;
    pbVar5 = pbVar5 + 1;
    p->pCur = (char *)pbVar5;
  }
  if (uVar7 == 0x2f) {
    bVar1 = pbVar5[1];
    uVar7 = (ulong)bVar1;
    if (bVar1 == 0x2a) {
      pbVar5 = pbVar5 + 2;
      p->pCur = (char *)pbVar5;
      if (pbVar8 <= pbVar5) goto LAB_003eb27b;
      while ((*pbVar5 != 0x2a || (pbVar5[1] != 0x2f))) {
        pbVar5 = pbVar5 + 1;
        p->pCur = (char *)pbVar5;
        if (pbVar5 == pbVar8) goto LAB_003eb27b;
      }
      pbVar5 = pbVar5 + 2;
    }
    else {
      if (bVar1 != 0x2f) goto LAB_003eb27b;
      pbVar5 = pbVar5 + 2;
      p->pCur = (char *)pbVar5;
      if (pbVar8 <= pbVar5) goto LAB_003eb27b;
      while (*pbVar5 != 10) {
        pbVar5 = pbVar5 + 1;
        p->pCur = (char *)pbVar5;
        if (pbVar5 == pbVar8) goto LAB_003eb27b;
      }
      pbVar5 = pbVar5 + 1;
    }
    p->pCur = (char *)pbVar5;
    goto LAB_003eb1d3;
  }
  if (uVar7 == 0) goto LAB_003eb415;
LAB_003eb27b:
  pbVar5 = (byte *)p->pCur;
  bVar1 = *pbVar5;
  uVar7 = (ulong)bVar1;
  uVar6 = (uint)bVar1;
  if (bVar1 == 0x2c) {
LAB_003eb28b:
    pbVar5 = pbVar5 + 1;
    do {
      uVar6 = (uint)uVar7;
      p->pCur = (char *)pbVar5;
      if (pbVar8 <= pbVar5) {
LAB_003eb328:
        if (p->ErrorStr[0] != '\0') goto LAB_003eb60d;
        builtin_strncpy(p->ErrorStr,"Unexpectedly reached end-of-file.",0x22);
        if (p->ErrorStr[0] != '\0') goto LAB_003eb60d;
        uVar14._0_1_ = ' ';
        uVar14._1_1_ = '1';
        uVar14._2_1_ = '9';
        uVar14._3_1_ = '.';
        goto LAB_003eb45f;
      }
      while( true ) {
        uVar7 = (ulong)*pbVar5;
        uVar6 = (uint)*pbVar5;
        if (0x2f < uVar7) goto LAB_003eb311;
        if ((0x100002600U >> (uVar7 & 0x3f) & 1) == 0) break;
        pbVar5 = pbVar5 + 1;
        p->pCur = (char *)pbVar5;
      }
      if (uVar7 != 0x2f) {
        if (uVar7 == 0) goto LAB_003eb328;
        goto LAB_003eb311;
      }
      bVar1 = pbVar5[1];
      uVar7 = (ulong)bVar1;
      if (bVar1 != 0x2a) goto LAB_003eb2ee;
      pbVar5 = pbVar5 + 2;
      p->pCur = (char *)pbVar5;
      if (pbVar8 <= pbVar5) goto LAB_003eb311;
      while ((*pbVar5 != 0x2a || (pbVar5[1] != 0x2f))) {
        pbVar5 = pbVar5 + 1;
        p->pCur = (char *)pbVar5;
        if (pbVar5 == pbVar8) goto LAB_003eb311;
      }
      pbVar5 = pbVar5 + 2;
    } while( true );
  }
  if (bVar1 != 0x29) {
    if (p->ErrorStr[0] != '\0') goto LAB_003eb60d;
    builtin_strncpy(p->ErrorStr + 0x10,"in the instance.",0x10);
    uVar10._0_1_ = 'E';
    uVar10._1_1_ = 'x';
    uVar10._2_1_ = 'p';
    uVar10._3_1_ = 'e';
    uVar11._0_1_ = 'c';
    uVar11._1_1_ = 't';
    uVar11._2_1_ = 'i';
    uVar11._3_1_ = 'n';
    uVar12._0_1_ = 'g';
    uVar12._1_1_ = ' ';
    uVar12._2_1_ = 'c';
    uVar12._3_1_ = 'o';
    uVar15._0_1_ = 'm';
    uVar15._1_1_ = 'm';
    uVar15._2_1_ = 'a';
    uVar15._3_1_ = ' ';
    uVar6 = (uint)bVar1;
    goto LAB_003eb601;
  }
  goto LAB_003eb4e3;
LAB_003eb3c9:
  if (p->ErrorStr[0] != '\0') goto LAB_003eb60d;
  builtin_strncpy(p->ErrorStr,"Unexpectedly reached end-of-file.",0x22);
  if (p->ErrorStr[0] != '\0') goto LAB_003eb60d;
  uVar14._0_1_ = ' ';
  uVar14._1_1_ = '1';
  uVar14._2_1_ = '7';
  uVar14._3_1_ = '.';
LAB_003eb45f:
  p->ErrorStr[0] = 'E';
  p->ErrorStr[1] = 'r';
  p->ErrorStr[2] = 'r';
  p->ErrorStr[3] = 'o';
  p->ErrorStr[4] = 'r';
  p->ErrorStr[5] = ' ';
  p->ErrorStr[6] = 'n';
  p->ErrorStr[7] = 'u';
  p->ErrorStr[8] = 'm';
  p->ErrorStr[9] = 'b';
  p->ErrorStr[10] = 'e';
  p->ErrorStr[0xb] = 'r';
  *(undefined4 *)(p->ErrorStr + 0xc) = uVar14;
  p->ErrorStr[0x10] = '\0';
LAB_003eb466:
  iVar4 = 0;
  goto LAB_003eb468;
LAB_003eb2ee:
  if (bVar1 != 0x2f) goto LAB_003eb311;
  pbVar5 = pbVar5 + 2;
  p->pCur = (char *)pbVar5;
  if (pbVar8 <= pbVar5) goto LAB_003eb311;
  while (*pbVar5 != 10) {
    pbVar5 = pbVar5 + 1;
    p->pCur = (char *)pbVar5;
    if (pbVar5 == pbVar8) goto LAB_003eb311;
  }
  goto LAB_003eb28b;
LAB_003eb311:
  uVar6 = (uint)uVar7;
  pcVar9 = p->pCur;
  if (*pcVar9 != '.') {
LAB_003eb4e3:
    uVar3 = (p->vTemp).nSize;
    if ((int)uVar3 < 1) {
      __assert_fail("Vec_IntSize(vTemp) > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadVer.c"
                    ,0x29a,"int Prs_ManReadSignalList2(Prs_Man_t *, Vec_Int_t *)");
    }
    iVar4 = 1;
    if ((uVar3 & 1) != 0) {
      __assert_fail("Vec_IntSize(vTemp) % 2 == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadVer.c"
                    ,0x29b,"int Prs_ManReadSignalList2(Prs_Man_t *, Vec_Int_t *)");
    }
LAB_003eb468:
    if (iVar4 == 0) {
      pcVar9 = "Error number 28.";
    }
    else {
      if (*p->pCur != ')') {
        __assert_fail("Prs_ManIsChar(p, \')\')",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadVer.c"
                      ,0x46a,"int Prs_ManReadInstance(Prs_Man_t *, int)");
      }
      p->pCur = p->pCur + 1;
      iVar4 = Prs_ManUtilSkipSpaces(p);
      uVar6 = extraout_EDX_00;
      if (iVar4 == 0) {
        if (*p->pCur == ';') {
          Prs_NtkAddBox(p->pNtk,Func,InstName,&p->vTemp);
          return 1;
        }
        pcVar9 = "Expecting semicolon in the instance.";
      }
      else {
        pcVar9 = "Error number 29.";
      }
    }
    Prs_ManErrorSet(p,pcVar9,uVar6);
    return 0;
  }
  goto LAB_003eafca;
}

Assistant:

static inline int Prs_ManReadInstance( Prs_Man_t * p, int Func )
{
    int InstId, Status;
    if ( Prs_ManUtilSkipSpaces(p) )         return Prs_ManErrorSet(p, "Error number 25.", 0);
    if ( Prs_ManIsChar(p, '#') )
    {
        p->pCur++;
        while ( Prs_ManIsDigit(p) )
            p->pCur++;
        if ( Prs_ManUtilSkipSpaces(p) )     return Prs_ManErrorSet(p, "Error number 25.", 0);
    }
    if ( (InstId = Prs_ManReadName(p)) )
        if (Prs_ManUtilSkipSpaces(p))       return Prs_ManErrorSet(p, "Error number 26.", 0);
    if ( !Prs_ManIsChar(p, '(') )           return Prs_ManErrorSet(p, "Expecting \"(\" in module instantiation.", 0);
    p->pCur++;
    if ( Prs_ManUtilSkipSpaces(p) )         return Prs_ManErrorSet(p, "Error number 27.", 0);
    if ( Prs_ManIsChar(p, '.') ) // box
        Status = Prs_ManReadSignalList2(p, &p->vTemp);
    else  // node
    {
        //char * s = Abc_NamStr(p->pStrs, Func);
        // translate elementary gate
        int iFuncNew = Prs_ManIsVerilogPrim(Abc_NamStr(p->pStrs, Func));
        if ( iFuncNew == 0 )                return Prs_ManErrorSet(p, "Cannot find elementary gate.", 0);
        Func = iFuncNew;
        Status = Prs_ManReadSignalList( p, &p->vTemp, ')', 1 );
    }
    if ( Status == 0 )                      return Prs_ManErrorSet(p, "Error number 28.", 0);
    assert( Prs_ManIsChar(p, ')') );
    p->pCur++;
    if ( Prs_ManUtilSkipSpaces(p) )         return Prs_ManErrorSet(p, "Error number 29.", 0);
    if ( !Prs_ManIsChar(p, ';') )           return Prs_ManErrorSet(p, "Expecting semicolon in the instance.", 0);
    // add box 
    Prs_NtkAddBox( p->pNtk, Func, InstId, &p->vTemp );
    return 1;
}